

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void mean_double_4_suite::test_linear_increase(void)

{
  value_type *pvVar1;
  moment<double,_4> filter;
  value_type local_80 [2];
  basic_moment<double,_4UL,_(trial::online::with)1> local_70;
  
  local_70.member.window.super_span<double,_4UL>.member.size = 0;
  local_70.member.window.super_span<double,_4UL>.member.next = 4;
  local_70.member.mean = 0.0;
  local_70.member.window.super_span<double,_4UL>.member.data = (pointer)&local_70;
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,1.0);
  local_80[0] = local_70.member.mean;
  pvVar1 = local_80 + 1;
  local_80[1] = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xf6,"void mean_double_4_suite::test_linear_increase()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,2.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 1.5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xf8,"void mean_double_4_suite::test_linear_increase()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,3.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 2.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","2.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xfa,"void mean_double_4_suite::test_linear_increase()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,4.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 2.5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","2.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xfc,"void mean_double_4_suite::test_linear_increase()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,5.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 3.5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","3.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xfe,"void mean_double_4_suite::test_linear_increase()",local_80,pvVar1);
  trial::online::window::basic_moment<double,_4UL,_(trial::online::with)1>::push(&local_70,6.0);
  local_80[0] = local_70.member.mean;
  local_80[1] = 4.5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","4.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x100,"void mean_double_4_suite::test_linear_increase()",local_80,pvVar1);
  return;
}

Assistant:

void test_linear_increase()
{
    window::moment<double, 4> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(2.0);
    TRIAL_TEST_EQ(filter.mean(), 1.5);
    filter.push(3.0);
    TRIAL_TEST_EQ(filter.mean(), 2.0);
    filter.push(4.0);
    TRIAL_TEST_EQ(filter.mean(), 2.5);
    filter.push(5.0);
    TRIAL_TEST_EQ(filter.mean(), 3.5);
    filter.push(6.0);
    TRIAL_TEST_EQ(filter.mean(), 4.5);
}